

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncTraits.h
# Opt level: O0

int luabridge::detail::
    Invoke<void,luabridge::detail::TypeList<char_const*,luabridge::detail::TypeList<char_const*,void>>,1>
    ::run<void(*)(char_const*,char_const*)>(lua_State *L,_func_void_char_ptr_char_ptr **fn)

{
  exception *e;
  undefined1 local_38 [8];
  ArgList<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_void>_>,_1>
  args;
  _func_void_char_ptr_char_ptr **fn_local;
  lua_State *L_local;
  
  args.
  super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_void>_>_>
  .tl._8_8_ = fn;
  ArgList<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_void>_>,_1>
  ::ArgList((ArgList<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_void>_>,_1>
             *)local_38,L);
  FuncTraits<void_(*)(const_char_*,_const_char_*),_void_(*)(const_char_*,_const_char_*)>::call
            ((DeclType *)
             args.
             super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_void>_>_>
             .tl._8_8_,
             (TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_void>_>_>
              *)local_38);
  return 0;
}

Assistant:

static int run(lua_State* L, Fn& fn)
    {
        try
        {
            ArgList<Params, startParam> args(L);
            FuncTraits<Fn>::call(fn, args);
            return 0;
        }
        catch (const std::exception& e)
        {
            return luaL_error(L, e.what());
        }
    }